

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O0

RawMsg * __thiscall SocketPP::RawMsg::toString_abi_cxx11_(RawMsg *this)

{
  char *pcVar1;
  ulong *in_RSI;
  allocator local_39;
  string local_38 [40];
  RawMsg *this_local;
  
  pcVar1 = (char *)in_RSI[1];
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::__cxx11::string::string((string *)this,local_38,0,*in_RSI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this;
}

Assistant:

std::string toString() const {
        return std::string((char*) data_, 0, len_);
    }